

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O0

int av1_is_leaf_split_partition(AV1_COMMON *cm,int mi_row,int mi_col,BLOCK_SIZE bsize)

{
  byte bVar1;
  BLOCK_SIZE bsize_00;
  PARTITION_TYPE PVar2;
  int iVar3;
  int iVar4;
  byte in_CL;
  int in_EDX;
  int in_ESI;
  AV1_COMMON *in_RDI;
  int y_idx;
  int x_idx;
  int i;
  BLOCK_SIZE subsize;
  int hbs;
  int bs;
  undefined4 in_stack_ffffffffffffffd4;
  uint uVar5;
  
  bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[in_CL];
  bsize_00 = get_partition_subsize
                       ((BLOCK_SIZE)((uint)in_stack_ffffffffffffffd4 >> 0x10),
                        (PARTITION_TYPE)((uint)in_stack_ffffffffffffffd4 >> 8));
  uVar5 = 0;
  while( true ) {
    if (3 < (int)uVar5) {
      return 1;
    }
    iVar3 = (uVar5 & 1) * (bVar1 / 2);
    iVar4 = ((int)uVar5 >> 1) * (bVar1 / 2);
    if (((in_RDI->mi_params).mi_rows <= in_ESI + iVar4) ||
       ((in_RDI->mi_params).mi_cols <= in_EDX + iVar3)) break;
    PVar2 = get_partition(in_RDI,in_ESI + iVar4,in_EDX + iVar3,bsize_00);
    if ((PVar2 != '\0') && (bsize_00 != BLOCK_8X8)) {
      return 0;
    }
    uVar5 = uVar5 + 1;
  }
  return 0;
}

Assistant:

int av1_is_leaf_split_partition(AV1_COMMON *cm, int mi_row, int mi_col,
                                BLOCK_SIZE bsize) {
  const int bs = mi_size_wide[bsize];
  const int hbs = bs / 2;
  assert(bsize >= BLOCK_8X8);
  const BLOCK_SIZE subsize = get_partition_subsize(bsize, PARTITION_SPLIT);

  for (int i = 0; i < 4; i++) {
    int x_idx = (i & 1) * hbs;
    int y_idx = (i >> 1) * hbs;
    if ((mi_row + y_idx >= cm->mi_params.mi_rows) ||
        (mi_col + x_idx >= cm->mi_params.mi_cols))
      return 0;
    if (get_partition(cm, mi_row + y_idx, mi_col + x_idx, subsize) !=
            PARTITION_NONE &&
        subsize != BLOCK_8X8)
      return 0;
  }
  return 1;
}